

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

char * __thiscall DnsStats::GetZonePrefix(DnsStats *this,char *dnsName)

{
  DnsPrefixClass DVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  DnsPrefixEntry *pDVar4;
  bool bVar5;
  int local_68;
  int offset;
  int local_54;
  int local_50;
  int previousPreviousOffset;
  int previousOffset;
  int prefixOffset;
  DnsPrefixEntry *retrieved;
  DnsPrefixEntry dpe;
  char *ret;
  char *dnsName_local;
  DnsStats *this_local;
  
  dpe.dnsPrefixClass = DnsPrefixStd;
  dpe._28_4_ = 0;
  DnsPrefixEntry::DnsPrefixEntry((DnsPrefixEntry *)&retrieved);
  previousPreviousOffset = 0;
  local_50 = -1;
  local_54 = -1;
  uVar3 = BinHash<DnsPrefixEntry>::GetSize(&this->dnsPrefixTable);
  if (uVar3 == 0) {
    LoadPrefixTable_from_memory(this);
  }
  while( true ) {
    bVar5 = false;
    if ((dpe._24_8_ == 0) && (bVar5 = false, dnsName != (char *)0x0)) {
      bVar5 = dnsName[previousPreviousOffset] != '.';
    }
    if (!bVar5) goto LAB_00198713;
    dpe._8_8_ = dnsName + previousPreviousOffset;
    dpe.HashNext._0_4_ = 0;
    pDVar4 = BinHash<DnsPrefixEntry>::Retrieve(&this->dnsPrefixTable,(DnsPrefixEntry *)&retrieved);
    if (pDVar4 != (DnsPrefixEntry *)0x0) break;
    local_68 = previousPreviousOffset;
    while( true ) {
      bVar5 = false;
      if (dnsName[local_68] != '\0') {
        bVar5 = dnsName[local_68] != '.';
      }
      if (!bVar5) break;
      local_68 = local_68 + 1;
    }
    if (dnsName[local_68] == '\0') {
      if (-1 < local_50) {
        dpe._24_8_ = dnsName + local_50;
      }
LAB_00198713:
      uVar2 = dpe._24_8_;
      DnsPrefixEntry::~DnsPrefixEntry((DnsPrefixEntry *)&retrieved);
      return (char *)uVar2;
    }
    local_54 = local_50;
    local_50 = previousPreviousOffset;
    previousPreviousOffset = local_68 + 1;
  }
  DVar1 = pDVar4->dnsPrefixClass;
  if (DVar1 != DnsPrefixStd) {
    if (DVar1 == DnsPrefixOneLevel) {
      if (-1 < local_54) {
        dpe._24_8_ = dnsName + local_54;
      }
      goto LAB_00198713;
    }
    if (DVar1 == DnsPrefixException) {
      dpe._24_8_ = dnsName + previousPreviousOffset;
      goto LAB_00198713;
    }
  }
  if (-1 < local_50) {
    dpe._24_8_ = dnsName + local_50;
  }
  goto LAB_00198713;
}

Assistant:

const char * DnsStats::GetZonePrefix(const char * dnsName)
{
    const char * ret = NULL;
    DnsPrefixEntry dpe;
    DnsPrefixEntry * retrieved;
    int prefixOffset = 0;
    int previousOffset = -1;
    int previousPreviousOffset = -1;

    if (dnsPrefixTable.GetSize() == 0) {
        LoadPrefixTable_from_memory();
    }

    while (ret == NULL && dnsName != NULL && dnsName[prefixOffset] != '.') {
        dpe.dnsPrefix = (char *)(dnsName + prefixOffset);
        dpe.hash = 0;

        if ((retrieved = dnsPrefixTable.Retrieve(&dpe)) != NULL)
        {
            switch (retrieved->dnsPrefixClass) {
            case DnsPrefixOneLevel:
                if (previousPreviousOffset >= 0) {
                    ret = dnsName + previousPreviousOffset;
                }
                break;
            case DnsPrefixException:
                ret = dnsName + prefixOffset;
                break;
            case DnsPrefixStd:
            default:
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            }
            break;
        } else {
            int offset = prefixOffset;

            while (dnsName[offset] != 0 && dnsName[offset] != '.') {
                offset++;
            }

            if (dnsName[offset] == 0) {
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            } else {
                previousPreviousOffset = previousOffset;
                previousOffset = prefixOffset;
                prefixOffset = offset + 1; /* Add 1 to skip the dot */
            }
        }
    }

    return ret;
}